

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlockMap.cpp
# Opt level: O1

PageMarkBitVector * __thiscall
Memory::HeapBlockMap64::GetPageMarkBitVector(HeapBlockMap64 *this,void *address)

{
  undefined4 *puVar1;
  L2MapChunk *this_00;
  code *pcVar2;
  bool bVar3;
  BVStatic<256UL> *pBVar4;
  Node *pNVar5;
  undefined8 *in_FS_OFFSET;
  
  for (pNVar5 = this->list; pNVar5 != (Node *)0x0; pNVar5 = pNVar5->next) {
    if (pNVar5->nodeIndex == (uint)((ulong)address >> 0x20)) goto LAB_0021671f;
  }
  pNVar5 = (Node *)0x0;
LAB_0021671f:
  if (pNVar5 == (Node *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                       ,0x526,"(node != nullptr)","node != nullptr");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar1 = 0;
  }
  this_00 = (pNVar5->map).map[(ulong)address >> 0x14 & 0xfff];
  if (this_00 != (L2MapChunk *)0x0) {
    pBVar4 = BVStatic<65536ul>::GetRange<256ul>
                       ((BVStatic<65536ul> *)this_00,(uint)address >> 4 & 0xff00);
    return pBVar4;
  }
  return (PageMarkBitVector *)0x0;
}

Assistant:

HeapBlockMap32::PageMarkBitVector *
HeapBlockMap64::GetPageMarkBitVector(void * address)
{
    Node * node = FindNode(address);
    Assert(node != nullptr);
    return node->map.GetPageMarkBitVector(address);
}